

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O2

void xmlFreeDocElementContent(xmlDocPtr doc,xmlElementContentPtr cur)

{
  _xmlElementContent *p_Var1;
  int iVar2;
  _xmlElementContent *p_Var3;
  xmlChar *pxVar4;
  _xmlDict *dict;
  long lVar5;
  
  if (cur == (xmlElementContentPtr)0x0) {
    return;
  }
  if (doc == (xmlDocPtr)0x0) {
    dict = (xmlDictPtr)0x0;
  }
  else {
    dict = doc->dict;
  }
  lVar5 = 0;
  do {
    while ((p_Var3 = cur->c1, p_Var3 != (_xmlElementContent *)0x0 ||
           (p_Var3 = cur->c2, p_Var3 != (_xmlElementContent *)0x0))) {
      lVar5 = lVar5 + 1;
      cur = p_Var3;
    }
    if (3 < cur->type - XML_ELEMENT_CONTENT_PCDATA) {
      xmlErrValid((xmlValidCtxtPtr)0x0,XML_ERR_INTERNAL_ERROR,
                  "Internal: ELEMENT content corrupted invalid type\n",(char *)0x0);
      return;
    }
    pxVar4 = cur->name;
    if (dict == (xmlDictPtr)0x0) {
      if (pxVar4 != (xmlChar *)0x0) {
        (*xmlFree)(pxVar4);
      }
      pxVar4 = cur->prefix;
      if (pxVar4 != (xmlChar *)0x0) {
LAB_001897cb:
        (*xmlFree)(pxVar4);
      }
    }
    else {
      if (pxVar4 != (xmlChar *)0x0) {
        iVar2 = xmlDictOwns(dict,pxVar4);
        if (iVar2 == 0) {
          (*xmlFree)(cur->name);
        }
      }
      if (cur->prefix != (xmlChar *)0x0) {
        iVar2 = xmlDictOwns(dict,cur->prefix);
        if (iVar2 == 0) {
          pxVar4 = cur->prefix;
          goto LAB_001897cb;
        }
      }
    }
    if ((lVar5 == 0) || (p_Var3 = cur->parent, p_Var3 == (_xmlElementContent *)0x0)) {
      (*xmlFree)(cur);
      return;
    }
    (&p_Var3->c1)[cur != p_Var3->c1] = (_xmlElementContent *)0x0;
    (*xmlFree)(cur);
    p_Var1 = p_Var3->c2;
    cur = p_Var1;
    if (p_Var1 == (_xmlElementContent *)0x0) {
      cur = p_Var3;
    }
    lVar5 = lVar5 - (ulong)(p_Var1 == (_xmlElementContent *)0x0);
  } while( true );
}

Assistant:

void
xmlFreeDocElementContent(xmlDocPtr doc, xmlElementContentPtr cur) {
    xmlDictPtr dict = NULL;
    size_t depth = 0;

    if (cur == NULL)
        return;
    if (doc != NULL)
        dict = doc->dict;

    while (1) {
        xmlElementContentPtr parent;

        while ((cur->c1 != NULL) || (cur->c2 != NULL)) {
            cur = (cur->c1 != NULL) ? cur->c1 : cur->c2;
            depth += 1;
        }

	switch (cur->type) {
	    case XML_ELEMENT_CONTENT_PCDATA:
	    case XML_ELEMENT_CONTENT_ELEMENT:
	    case XML_ELEMENT_CONTENT_SEQ:
	    case XML_ELEMENT_CONTENT_OR:
		break;
	    default:
		xmlErrValid(NULL, XML_ERR_INTERNAL_ERROR,
			"Internal: ELEMENT content corrupted invalid type\n",
			NULL);
		return;
	}
	if (dict) {
	    if ((cur->name != NULL) && (!xmlDictOwns(dict, cur->name)))
	        xmlFree((xmlChar *) cur->name);
	    if ((cur->prefix != NULL) && (!xmlDictOwns(dict, cur->prefix)))
	        xmlFree((xmlChar *) cur->prefix);
	} else {
	    if (cur->name != NULL) xmlFree((xmlChar *) cur->name);
	    if (cur->prefix != NULL) xmlFree((xmlChar *) cur->prefix);
	}
        parent = cur->parent;
        if ((depth == 0) || (parent == NULL)) {
            xmlFree(cur);
            break;
        }
        if (cur == parent->c1)
            parent->c1 = NULL;
        else
            parent->c2 = NULL;
	xmlFree(cur);

        if (parent->c2 != NULL) {
	    cur = parent->c2;
        } else {
            depth -= 1;
            cur = parent;
        }
    }
}